

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringTests.cpp
# Opt level: O3

bool vkt::texture::anon_unknown_0::verifierCanBeUsed
               (VkFormat format,FilterMode minFilter,FilterMode magFilter)

{
  byte bVar1;
  TextureChannelClass TVar2;
  TextureFormat TVar3;
  
  TVar3 = ::vk::mapVkFormat(format);
  TVar2 = tcu::getTextureChannelClass(TVar3.type);
  bVar1 = 1;
  if ((TEXTURECHANNELCLASS_FLOATING_POINT < TVar2) || ((0x13U >> (TVar2 & 0x1f) & 1) == 0)) {
    if ((minFilter < FILTERMODE_LAST) && ((0x32U >> (minFilter & 0x1f) & 1) != 0)) {
      bVar1 = 0;
    }
    else if (magFilter < FILTERMODE_LAST) {
      bVar1 = 0xd >> ((byte)magFilter & 0x1f);
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool verifierCanBeUsed(const VkFormat format, const Sampler::FilterMode minFilter, const Sampler::FilterMode magFilter)
{
	const tcu::TextureFormat				textureFormat		= mapVkFormat(format);
	const tcu::TextureChannelClass			textureChannelClass	= tcu::getTextureChannelClass(textureFormat.type);

	return !(!(textureChannelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			   textureChannelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			   textureChannelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT) &&
			  (tcu::TexVerifierUtil::isLinearFilter(minFilter) || tcu::TexVerifierUtil::isLinearFilter(magFilter)));
}